

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListIteratorTest_cbegin_cend_backward_Test::
~IntrusiveListIteratorTest_cbegin_cend_backward_Test
          (IntrusiveListIteratorTest_cbegin_cend_backward_Test *this)

{
  IntrusiveListIteratorTest_cbegin_cend_backward_Test *this_local;
  
  ~IntrusiveListIteratorTest_cbegin_cend_backward_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, cbegin_cend_backward) {
  TestBackward(list_.cbegin(), list_.cend(), {3, 2, 1});
  TestBackward(clist_.cbegin(), clist_.cend(), {3, 2, 1});
}